

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_tree.cpp
# Opt level: O1

void __thiscall HuffTree::HuffTree(HuffTree *this)

{
  TreeNode *pTVar1;
  pointer *__ptr;
  
  this->curr_node = (TreeNode *)0x0;
  (this->root)._M_t.
  super___uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>._M_t.
  super__Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>.
  super__Head_base<0UL,_HuffTree::TreeNode_*,_false>._M_head_impl = (TreeNode *)0x0;
  pTVar1 = (TreeNode *)operator_new(0x20);
  pTVar1->_data = ' ';
  *(undefined3 *)&pTVar1->field_0x1 = 0;
  pTVar1->_freq = 0;
  (pTVar1->_left)._M_t.
  super___uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> =
       (__uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>)0x0;
  (pTVar1->_right)._M_t.
  super___uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> =
       (__uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>)0x0;
  pTVar1->_is_leaf = true;
  (this->root)._M_t.
  super___uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>._M_t.
  super__Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>.
  super__Head_base<0UL,_HuffTree::TreeNode_*,_false>._M_head_impl = pTVar1;
  return;
}

Assistant:

HuffTree::HuffTree() {
    root = std::make_unique<TreeNode>(TreeNode());
}